

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHDivProjection.cpp
# Opt level: O2

void __thiscall
TPZHDivProjection<double>::Contribute
          (TPZHDivProjection<double> *this,TPZMaterialDataT<double> *data,REAL weight,
          TPZFMatrix<double> *ek,TPZFMatrix<double> *ef)

{
  TPZFNMatrix<20,_double> *pTVar1;
  TPZFNMatrix<60,_double> *pTVar2;
  TPZFNMatrix<9,_double> *this_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  ulong uVar10;
  pair<int,_long> *ppVar11;
  char cVar12;
  double *pdVar13;
  ulong col;
  ulong row;
  ulong uVar14;
  long lVar15;
  int iloc;
  int id;
  long lVar16;
  long row_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double local_3c0;
  int local_3b8;
  double local_3b0;
  int local_398;
  double local_338;
  TPZManVector<double,_4> solLoc;
  TPZFNMatrix<3,_double> ivec;
  TPZFNMatrix<3,_double> axesvec_1;
  TPZFNMatrix<3,_double> axesvec;
  TPZFNMatrix<3,_double> jvec;
  
  TPZManVector<double,_4>::TPZManVector(&solLoc,4);
  cVar12 = (**(code **)(*(long *)this + 0x60))(this);
  if (cVar12 == '\0') {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZHDivProjection<>::Contribute(const TPZMaterialDataT<TVar> &, REAL, TPZFMatrix<TVar> &, TPZFMatrix<TVar> &) [TVar = double]"
                   );
    std::operator<<((ostream *)&std::cerr," a forcing function (solution to be projected)\n");
    std::operator<<((ostream *)&std::cerr,"has not been set! Aborting...\n");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Material/Projection/TPZHDivProjection.cpp"
               ,0x1e);
  }
  std::function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)>::operator()
            ((function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)> *)&this->field_0x18,
             &(data->super_TPZMaterialData).x.super_TPZVec<double>,&solLoc.super_TPZVec<double>);
  uVar10 = (data->super_TPZMaterialData).fVecShapeIndex.super_TPZVec<std::pair<int,_long>_>.
           fNElements;
  jvec.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<3,_double>::TPZFNMatrix(&ivec,3,1,(double *)&jvec);
  axesvec.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<3,_double>::TPZFNMatrix(&jvec,3,1,(double *)&axesvec);
  pTVar1 = &(data->super_TPZMaterialData).phi;
  pTVar2 = &(data->super_TPZMaterialData).dphix;
  this_00 = &(data->super_TPZMaterialData).axes;
  row = 0;
  uVar14 = uVar10 & 0xffffffff;
  if ((int)uVar10 < 1) {
    uVar14 = row;
  }
  for (; row != uVar14; row = row + 1) {
    ppVar11 = (data->super_TPZMaterialData).fVecShapeIndex.super_TPZVec<std::pair<int,_long>_>.
              fStore;
    iVar9 = ppVar11[row].first;
    lVar15 = ppVar11[row].second;
    for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
      dVar3 = (data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.fElem
              [(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
               super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * (long)iVar9 + lVar16];
      pdVar13 = TPZFMatrix<double>::operator()(&ivec.super_TPZFMatrix<double>,lVar16,0);
      *pdVar13 = dVar3;
    }
    local_3c0 = 0.0;
    for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
      pdVar13 = TPZFMatrix<double>::operator()(&ivec.super_TPZFMatrix<double>,lVar16,0);
      local_3c0 = local_3c0 + *pdVar13 * solLoc.super_TPZVec<double>.fStore[lVar16];
    }
    local_3b8 = (int)lVar15;
    lVar15 = (long)local_3b8;
    (*(pTVar1->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0x24])(pTVar1,lVar15,0);
    pdVar13 = TPZFMatrix<double>::operator()(ef,row,0);
    *pdVar13 = local_3c0 * weight * extraout_XMM0_Qa + *pdVar13;
    axesvec_1.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<3,_double>::TPZFNMatrix(&axesvec,3,1,(double *)&axesvec_1);
    TPZMatrix<double>::Multiply
              ((TPZMatrix<double> *)this_00,&ivec.super_TPZFMatrix<double>,
               &axesvec.super_TPZFMatrix<double>,0);
    local_3b0 = 0.0;
    for (lVar16 = 0; lVar16 < this->fDim; lVar16 = lVar16 + 1) {
      pdVar13 = TPZFMatrix<double>::operator()(&axesvec.super_TPZFMatrix<double>,lVar16,0);
      dVar3 = *pdVar13;
      (*(pTVar2->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable[0x24])(pTVar2,lVar16,lVar15);
      local_3b0 = local_3b0 + dVar3 * extraout_XMM0_Qa_00;
    }
    for (col = 0; col != (uVar10 & 0xffffffff); col = col + 1) {
      ppVar11 = (data->super_TPZMaterialData).fVecShapeIndex.super_TPZVec<std::pair<int,_long>_>.
                fStore;
      iVar9 = ppVar11[col].first;
      lVar16 = ppVar11[col].second;
      for (row_00 = 0; row_00 != 3; row_00 = row_00 + 1) {
        dVar3 = (data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.fElem
                [(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                 super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * (long)iVar9 + row_00];
        pdVar13 = TPZFMatrix<double>::operator()(&jvec.super_TPZFMatrix<double>,row_00,0);
        *pdVar13 = dVar3;
      }
      pdVar13 = TPZFMatrix<double>::operator()(&ivec.super_TPZFMatrix<double>,0,0);
      dVar3 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(&jvec.super_TPZFMatrix<double>,0,0);
      dVar4 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(&ivec.super_TPZFMatrix<double>,1,0);
      dVar5 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(&jvec.super_TPZFMatrix<double>,1,0);
      dVar6 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(&ivec.super_TPZFMatrix<double>,2,0);
      dVar7 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(&jvec.super_TPZFMatrix<double>,2,0);
      dVar8 = *pdVar13;
      (*(pTVar1->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable[0x24])(pTVar1,lVar15,0);
      local_398 = (int)lVar16;
      (*(pTVar1->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable[0x24])(pTVar1,(long)local_398,0);
      pdVar13 = TPZFMatrix<double>::operator()(ek,row,col);
      *pdVar13 = extraout_XMM0_Qa_01 * weight * extraout_XMM0_Qa_02 *
                 (dVar7 * dVar8 + dVar3 * dVar4 + dVar5 * dVar6) + *pdVar13;
      local_338 = 0.0;
      TPZFNMatrix<3,_double>::TPZFNMatrix(&axesvec_1,3,1,&local_338);
      TPZMatrix<double>::Multiply
                ((TPZMatrix<double> *)this_00,&jvec.super_TPZFMatrix<double>,
                 &axesvec_1.super_TPZFMatrix<double>,0);
      local_3c0 = 0.0;
      for (lVar16 = 0; lVar16 < this->fDim; lVar16 = lVar16 + 1) {
        pdVar13 = TPZFMatrix<double>::operator()(&axesvec_1.super_TPZFMatrix<double>,lVar16,0);
        dVar3 = *pdVar13;
        (*(pTVar2->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable[0x24])(pTVar2,lVar16,(long)local_398);
        local_3c0 = local_3c0 + dVar3 * extraout_XMM0_Qa_03;
      }
      pdVar13 = TPZFMatrix<double>::operator()(ek,row,col);
      *pdVar13 = local_3c0 * local_3b0 * weight + *pdVar13;
      TPZFNMatrix<3,_double>::~TPZFNMatrix(&axesvec_1);
    }
    TPZFNMatrix<3,_double>::~TPZFNMatrix(&axesvec);
  }
  TPZFNMatrix<3,_double>::~TPZFNMatrix(&jvec);
  TPZFNMatrix<3,_double>::~TPZFNMatrix(&ivec);
  TPZManVector<double,_4>::~TPZManVector(&solLoc);
  return;
}

Assistant:

void TPZHDivProjection<TVar>::Contribute(const TPZMaterialDataT<TVar> &data,
                                       REAL weight,
                                       TPZFMatrix<TVar> &ek, TPZFMatrix<TVar> &ef){
	
	const int nshape = data.phi.Rows();
    //last position of solLoc is the divergence
    TPZManVector<TVar,4> solLoc(4);
    if(!this->HasForcingFunction()){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" a forcing function (solution to be projected)\n";
        PZError<<"has not been set! Aborting...\n";
        DebugStop();
    }
    this->fForcingFunction(data.x,solLoc);
    const TVar divSol = solLoc[3];

    /*
     * HDiv approximation spaces in NeoPZ are created 
     * from the combination of scalar functions with 
     * constant vector fields
     */
    
    // Setting the scalar phis
    const TPZFMatrix<REAL> &phiQ = data.phi;
    const TPZFMatrix<REAL> &dphiQ = data.dphix;
    
    const int phrq = data.fVecShapeIndex.NElements();
    
    //Calculate the matrix contribution for flux. Matrix A
    TPZFNMatrix<3,REAL> ivec(3,1,0.);
    TPZFNMatrix<3,REAL> jvec(3,1,0.);
    for(int iq=0; iq<phrq; iq++)
    {
        //ef(iq, 0) += 0.;
        const int ivecind = data.fVecShapeIndex[iq].first;
        const int ishapeind = data.fVecShapeIndex[iq].second;
        
        for(int id=0; id<3; id++){
            ivec(id,0) = data.fDeformedDirections.GetVal(id,ivecind);
        }
        TVar ff = 0.;
        
        for (int i=0; i<3; i++) {
            ff += ivec(i,0)*solLoc[i];
        }
        
        ef(iq,0) += weight*ff*phiQ.GetVal(ishapeind,0);
        REAL divqi = 0.;
        TPZFNMatrix<3,REAL> axesvec(3,1,0.);
        data.axes.Multiply(ivec,axesvec);
        //computin div(qj)
        for(int iloc=0; iloc<fDim; iloc++){
            divqi += axesvec(iloc,0)*dphiQ.GetVal(iloc,ishapeind);
        }
        for (int jq=0; jq<phrq; jq++)
        {
            int jvecind = data.fVecShapeIndex[jq].first;
            int jshapeind = data.fVecShapeIndex[jq].second;
            
            for(int id=0; id<3; id++){
                jvec(id,0) = data.fDeformedDirections.GetVal(id,jvecind);
            }
            
            //jvecZ.Print("mat1 = ");
            const REAL prod1 = ivec(0,0)*jvec(0,0) + ivec(1,0)*jvec(1,0) + ivec(2,0)*jvec(2,0);
            ek(iq,jq) +=
                    weight*phiQ.GetVal(ishapeind,0)*phiQ.GetVal(jshapeind,0)*prod1;

            REAL divqj = 0.;
            TPZFNMatrix<3,REAL> axesvec(3,1,0.);
            data.axes.Multiply(jvec,axesvec);
            //computin div(qj)
            for(int jloc=0; jloc<fDim; jloc++){
                divqj += axesvec(jloc,0)*dphiQ.GetVal(jloc,jshapeind);
            }
            ek(iq,jq) += weight*divqi*divqj;
        }
    }
}